

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

UChar mmed3(UChar a,UChar b,UChar c)

{
  UChar t;
  UChar c_local;
  UChar b_local;
  UChar a_local;
  
  b_local = b;
  a_local = a;
  if (b < a) {
    b_local = a;
    a_local = b;
  }
  if ((c < b_local) && (b_local = c, c < a_local)) {
    b_local = a_local;
  }
  return b_local;
}

Assistant:

static 
__inline__
UChar mmed3 ( UChar a, UChar b, UChar c )
{
   UChar t;
   if (a > b) { t = a; a = b; b = t; };
   if (b > c) { 
      b = c;
      if (a > b) b = a;
   }
   return b;
}